

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenStore(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,uint32_t align,
             BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
             char *memoryName)

{
  BinaryenExpressionRef value_00;
  BinaryenExpressionRef ptr_00;
  uint32_t bytes_00;
  Store *pSVar1;
  Name memory;
  uint32_t local_60;
  Type local_48;
  Address local_40;
  Builder local_38;
  BinaryenExpressionRef local_30;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef ptr_local;
  uint local_18;
  uint32_t align_local;
  uint32_t offset_local;
  uint32_t bytes_local;
  BinaryenModuleRef module_local;
  
  local_30 = value;
  value_local = ptr;
  ptr_local._4_4_ = align;
  local_18 = offset;
  align_local = bytes;
  _offset_local = module;
  wasm::Builder::Builder(&local_38,module);
  bytes_00 = align_local;
  wasm::Address::Address(&local_40,(ulong)local_18);
  ptr_00 = value_local;
  value_00 = local_30;
  if (ptr_local._4_4_ == 0) {
    local_60 = align_local;
  }
  else {
    local_60 = ptr_local._4_4_;
  }
  wasm::Type::Type(&local_48,type);
  memory = getMemoryName(_offset_local,memoryName);
  pSVar1 = wasm::Builder::makeStore
                     (&local_38,bytes_00,local_40,local_60,ptr_00,value_00,local_48,memory);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStore(BinaryenModuleRef module,
                                    uint32_t bytes,
                                    uint32_t offset,
                                    uint32_t align,
                                    BinaryenExpressionRef ptr,
                                    BinaryenExpressionRef value,
                                    BinaryenType type,
                                    const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStore(bytes,
                 offset,
                 align ? align : bytes,
                 (Expression*)ptr,
                 (Expression*)value,
                 Type(type),
                 getMemoryName(module, memoryName)));
}